

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O3

size_t __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::
queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
::demands_count(queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                *this,demands_counter_t *external_counter)

{
  lock_t *plVar1;
  _Map_pointer ppeVar2;
  _Elt_pointer peVar3;
  _Elt_pointer peVar4;
  _Map_pointer ppeVar5;
  _Elt_pointer peVar6;
  _Elt_pointer peVar7;
  __int_type _Var8;
  
  plVar1 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_lock._M_t.
           super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
           .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  (*plVar1->_vptr_lock_t[2])(plVar1);
  ppeVar2 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_demands.
            super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  peVar3 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_demands.
           super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  peVar4 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_demands.
           super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  ppeVar5 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_demands.
            super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
            _M_impl.super__Deque_impl_data._M_start._M_node;
  peVar6 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_demands.
           super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_first;
  peVar7 = (this->super_no_activity_tracking_impl_t).super_common_data_t.m_demands.
           super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  _Var8 = (external_counter->super___atomic_base<unsigned_long>)._M_i;
  (*plVar1->_vptr_lock_t[3])(plVar1);
  return _Var8 + ((long)peVar4 - (long)peVar7 >> 4) * -0x5555555555555555 +
         ((long)peVar3 - (long)peVar6 >> 4) * -0x5555555555555555 +
         (((long)ppeVar2 - (long)ppeVar5 >> 3) + -1 + (ulong)(ppeVar2 == (_Map_pointer)0x0)) * 10;
}

Assistant:

std::size_t
	demands_count( const demands_counter_t & external_counter )
	{
		queue_traits::lock_guard_t lock{ *(this->m_lock) };

		return this->m_demands.size()
				+ external_counter.load( std::memory_order_acquire );
	}